

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

void ImageFormat(Image *image,int newFormat)

{
  undefined4 uVar1;
  ushort uVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  undefined6 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  unsigned_short uVar13;
  int i_2;
  float *__ptr;
  void *pvVar14;
  float *pfVar15;
  uint uVar16;
  ulong uVar17;
  int i;
  int iVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar25;
  char cVar26;
  char cVar27;
  float fStack_44;
  
  pvVar14 = image->data;
  if ((((pvVar14 != (void *)0x0) && (image->width != 0)) && (newFormat != 0 && image->height != 0))
     && (iVar19 = image->format, iVar19 != newFormat)) {
    if (0xd < newFormat || 0xd < iVar19) {
      TraceLog(4,"IMAGE: Data format is compressed, can not be converted");
      return;
    }
    uVar16 = image->height * image->width;
    __ptr = (float *)malloc((long)(int)uVar16 << 4);
    uVar21 = 0;
    uVar17 = (ulong)uVar16;
    if ((int)uVar16 < 1) {
      uVar17 = uVar21;
    }
    pfVar15 = __ptr + 3;
    iVar18 = 0;
    for (; uVar17 != uVar21; uVar21 = uVar21 + 1) {
      if (0xc < iVar19 - 1U) goto LAB_0013f323;
      lVar20 = (long)iVar18;
      switch(iVar19) {
      case 1:
        pfVar15[-3] = (float)*(byte *)((long)pvVar14 + uVar21) / 255.0;
        pfVar15[-2] = (float)*(byte *)((long)pvVar14 + uVar21) / 255.0;
        pfVar15[-1] = (float)*(byte *)((long)pvVar14 + uVar21) / 255.0;
        goto LAB_0013f2e8;
      case 2:
        pfVar15[-3] = (float)*(byte *)((long)pvVar14 + lVar20) / 255.0;
        pfVar15[-2] = (float)*(byte *)((long)pvVar14 + lVar20) / 255.0;
        pfVar15[-1] = (float)*(byte *)((long)pvVar14 + lVar20) / 255.0;
        *pfVar15 = (float)*(byte *)((long)pvVar14 + lVar20 + 1) / 255.0;
        iVar18 = iVar18 + 2;
        break;
      case 3:
        uVar2 = *(ushort *)((long)pvVar14 + uVar21 * 2);
        pfVar15[-3] = (float)(uVar2 >> 0xb) * 0.032258064;
        pfVar15[-2] = (float)(uVar2 >> 5 & 0x3f) * 0.015873017;
        pfVar15[-1] = (float)(uVar2 & 0x1f) * 0.032258064;
        goto LAB_0013f2e8;
      case 4:
        pfVar15[-3] = (float)*(byte *)((long)pvVar14 + lVar20) / 255.0;
        pfVar15[-2] = (float)*(byte *)((long)pvVar14 + lVar20 + 1) / 255.0;
        fVar8 = (float)*(byte *)((long)pvVar14 + lVar20 + 2) / 255.0;
        uVar22 = SUB41(fVar8,0);
        uVar23 = (undefined1)((uint)fVar8 >> 8);
        uVar24 = (undefined1)((uint)fVar8 >> 0x10);
        uVar25 = (undefined1)((uint)fVar8 >> 0x18);
        goto LAB_0013f311;
      case 5:
        uVar2 = *(ushort *)((long)pvVar14 + uVar21 * 2);
        pfVar15[-3] = (float)(uVar2 >> 0xb) * 0.032258064;
        pfVar15[-2] = (float)(uVar2 >> 6 & 0x1f) * 0.032258064;
        pfVar15[-1] = (float)(uVar2 >> 1 & 0x1f) * 0.032258064;
        uVar22 = 0;
        uVar23 = 0;
        if ((uVar2 & 1) != 0) {
          uVar22 = 0x80;
          uVar23 = 0x3f;
        }
        *pfVar15 = (float)((uint)CONCAT11(uVar23,uVar22) << 0x10);
        break;
      case 6:
        uVar2 = *(ushort *)((long)pvVar14 + uVar21 * 2);
        pfVar15[-3] = (float)(uVar2 >> 0xc) * 0.06666667;
        pfVar15[-2] = (float)(uVar2 >> 8 & 0xf) * 0.06666667;
        pfVar15[-1] = (float)(uVar2 >> 4 & 0xf) * 0.06666667;
        *pfVar15 = (float)(uVar2 & 0xf) * 0.06666667;
        break;
      case 7:
        pfVar15[-3] = (float)*(byte *)((long)pvVar14 + lVar20) / 255.0;
        pfVar15[-2] = (float)*(byte *)((long)pvVar14 + lVar20 + 1) / 255.0;
        pfVar15[-1] = (float)*(byte *)((long)pvVar14 + lVar20 + 2) / 255.0;
        fVar8 = (float)*(byte *)((long)pvVar14 + lVar20 + 3) / 255.0;
        uVar22 = SUB41(fVar8,0);
        uVar23 = (undefined1)((uint)fVar8 >> 8);
        uVar24 = (undefined1)((uint)fVar8 >> 0x10);
        uVar25 = (undefined1)((uint)fVar8 >> 0x18);
        goto LAB_0013f2b5;
      case 8:
        uVar1 = *(undefined4 *)((long)pvVar14 + lVar20 * 4);
        uVar22 = (undefined1)uVar1;
        uVar23 = (undefined1)((uint)uVar1 >> 8);
        uVar24 = (undefined1)((uint)uVar1 >> 0x10);
        uVar25 = (undefined1)((uint)uVar1 >> 0x18);
        goto LAB_0013f2dd;
      case 9:
        pfVar15[-3] = *(float *)((long)pvVar14 + lVar20 * 4);
        pfVar15[-2] = *(float *)((long)pvVar14 + lVar20 * 4 + 4);
        uVar1 = *(undefined4 *)((long)pvVar14 + lVar20 * 4 + 8);
        uVar22 = (undefined1)uVar1;
        uVar23 = (undefined1)((uint)uVar1 >> 8);
        uVar24 = (undefined1)((uint)uVar1 >> 0x10);
        uVar25 = (undefined1)((uint)uVar1 >> 0x18);
        goto LAB_0013f311;
      case 10:
        pfVar15[-3] = *(float *)((long)pvVar14 + lVar20 * 4);
        pfVar15[-2] = *(float *)((long)pvVar14 + lVar20 * 4 + 4);
        pfVar15[-1] = *(float *)((long)pvVar14 + lVar20 * 4 + 8);
        uVar1 = *(undefined4 *)((long)pvVar14 + lVar20 * 4 + 0xc);
        uVar22 = (undefined1)uVar1;
        uVar23 = (undefined1)((uint)uVar1 >> 8);
        uVar24 = (undefined1)((uint)uVar1 >> 0x10);
        uVar25 = (undefined1)((uint)uVar1 >> 0x18);
        goto LAB_0013f2b5;
      case 0xb:
        fVar8 = HalfToFloat(*(unsigned_short *)((long)pvVar14 + lVar20 * 2));
        uVar22 = SUB41(fVar8,0);
        uVar23 = (undefined1)((uint)fVar8 >> 8);
        uVar24 = (undefined1)((uint)fVar8 >> 0x10);
        uVar25 = (undefined1)((uint)fVar8 >> 0x18);
LAB_0013f2dd:
        pfVar15[-3] = (float)CONCAT13(uVar25,CONCAT12(uVar24,CONCAT11(uVar23,uVar22)));
        pfVar15[-2] = 0.0;
        pfVar15[-1] = 0.0;
LAB_0013f2e8:
        *pfVar15 = 1.0;
        break;
      case 0xc:
        fVar8 = HalfToFloat(*(unsigned_short *)((long)pvVar14 + lVar20 * 2));
        pfVar15[-3] = fVar8;
        fVar8 = HalfToFloat(*(unsigned_short *)((long)pvVar14 + lVar20 * 2 + 2));
        pfVar15[-2] = fVar8;
        fVar8 = HalfToFloat(*(unsigned_short *)((long)pvVar14 + lVar20 * 2 + 4));
        uVar22 = SUB41(fVar8,0);
        uVar23 = (undefined1)((uint)fVar8 >> 8);
        uVar24 = (undefined1)((uint)fVar8 >> 0x10);
        uVar25 = (undefined1)((uint)fVar8 >> 0x18);
LAB_0013f311:
        pfVar15[-1] = (float)CONCAT13(uVar25,CONCAT12(uVar24,CONCAT11(uVar23,uVar22)));
        *pfVar15 = 1.0;
        iVar18 = iVar18 + 3;
        break;
      case 0xd:
        fVar8 = HalfToFloat(*(unsigned_short *)((long)pvVar14 + lVar20 * 2));
        pfVar15[-3] = fVar8;
        fVar8 = HalfToFloat(*(unsigned_short *)((long)pvVar14 + lVar20 * 2 + 2));
        pfVar15[-2] = fVar8;
        fVar8 = HalfToFloat(*(unsigned_short *)((long)pvVar14 + lVar20 * 2 + 4));
        pfVar15[-1] = fVar8;
        fVar8 = HalfToFloat(*(unsigned_short *)((long)pvVar14 + lVar20 * 2 + 6));
        uVar22 = SUB41(fVar8,0);
        uVar23 = (undefined1)((uint)fVar8 >> 8);
        uVar24 = (undefined1)((uint)fVar8 >> 0x10);
        uVar25 = (undefined1)((uint)fVar8 >> 0x18);
LAB_0013f2b5:
        *pfVar15 = (float)CONCAT13(uVar25,CONCAT12(uVar24,CONCAT11(uVar23,uVar22)));
        iVar18 = iVar18 + 4;
      }
LAB_0013f323:
      pfVar15 = pfVar15 + 4;
    }
    free(pvVar14);
    image->data = (void *)0x0;
    image->format = newFormat;
    switch(newFormat) {
    case 1:
      iVar19 = image->width;
      iVar18 = image->height;
      pvVar14 = malloc((long)(iVar18 * iVar19));
      image->data = pvVar14;
      pfVar15 = __ptr + 1;
      for (lVar20 = 0; lVar20 < iVar18 * iVar19; lVar20 = lVar20 + 1) {
        *(char *)((long)image->data + lVar20) =
             (char)(int)(((float)((ulong)*(undefined8 *)pfVar15 >> 0x20) * 0.114 +
                         pfVar15[-1] * 0.299 + (float)*(undefined8 *)pfVar15 * 0.587) * 255.0);
        iVar19 = image->width;
        iVar18 = image->height;
        pfVar15 = pfVar15 + 4;
      }
      break;
    case 2:
      iVar19 = image->width;
      iVar18 = image->height;
      pvVar14 = malloc((long)(iVar19 * iVar18 * 2));
      image->data = pvVar14;
      for (lVar20 = 0; lVar20 < iVar18 * iVar19 * 2; lVar20 = lVar20 + 2) {
        *(char *)((long)image->data + lVar20) =
             (char)(int)(((float)((ulong)*(undefined8 *)(__ptr + lVar20 * 2 + 1) >> 0x20) * 0.114 +
                         __ptr[lVar20 * 2] * 0.299 +
                         (float)*(undefined8 *)(__ptr + lVar20 * 2 + 1) * 0.587) * 255.0);
        *(char *)((long)image->data + lVar20 + 1) = (char)(int)(__ptr[lVar20 * 2 + 3] * 255.0);
        iVar19 = image->width;
        iVar18 = image->height;
      }
      break;
    case 3:
      iVar19 = image->width;
      iVar18 = image->height;
      pvVar14 = malloc((long)(iVar18 * iVar19) * 2);
      image->data = pvVar14;
      pfVar15 = __ptr + 2;
      for (lVar20 = 0; lVar20 < iVar18 * iVar19; lVar20 = lVar20 + 1) {
        fVar8 = roundf(*pfVar15 * 31.0);
        fVar9 = (float)*(undefined8 *)(pfVar15 + -2) * 31.0;
        fVar11 = (float)((ulong)*(undefined8 *)(pfVar15 + -2) >> 0x20) * 63.0;
        fVar10 = roundf(fVar9);
        fStack_44 = (float)(CONCAT17((char)((uint)fVar11 >> 0x18),
                                     CONCAT16((char)((uint)fVar11 >> 0x10),
                                              CONCAT15((char)((uint)fVar11 >> 8),
                                                       CONCAT14(SUB41(fVar11,0),fVar9)))) >> 0x20);
        fVar9 = roundf(fStack_44);
        iVar19 = (int)fVar10;
        iVar18 = (int)fVar9;
        cVar27 = (char)((uint)iVar18 >> 0x10);
        uVar7 = CONCAT15((char)((uint)iVar18 >> 8),CONCAT14((char)iVar18,iVar19));
        sVar4 = (short)iVar19;
        sVar5 = (short)((uint6)uVar7 >> 0x20);
        sVar6 = (short)(CONCAT17((char)((uint)iVar18 >> 0x18),CONCAT16(cVar27,uVar7)) >> 0x30);
        *(ushort *)((long)image->data + lVar20 * 2) =
             (ushort)(int)fVar8 & 0xff |
             CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar27 - (0xff < sVar6),
                      (0 < sVar5) * (sVar5 < 0x100) * (char)iVar18 - (0xff < sVar5)) * 0x20 |
             (ushort)(byte)((0 < sVar4) * (sVar4 < 0x100) * (char)iVar19 - (0xff < sVar4)) * 0x800;
        iVar19 = image->width;
        iVar18 = image->height;
        pfVar15 = pfVar15 + 4;
      }
      break;
    case 4:
      iVar19 = image->width;
      iVar18 = image->height;
      pvVar14 = malloc((long)(iVar19 * iVar18 * 3));
      image->data = pvVar14;
      pfVar15 = __ptr + 2;
      for (lVar20 = 0; lVar20 < iVar18 * iVar19 * 3; lVar20 = lVar20 + 3) {
        *(char *)((long)image->data + lVar20) = (char)(int)(pfVar15[-2] * 255.0);
        *(char *)((long)image->data + lVar20 + 1) = (char)(int)(pfVar15[-1] * 255.0);
        *(char *)((long)image->data + lVar20 + 2) = (char)(int)(*pfVar15 * 255.0);
        iVar19 = image->width;
        iVar18 = image->height;
        pfVar15 = pfVar15 + 4;
      }
      break;
    case 5:
      iVar19 = image->width;
      iVar18 = image->height;
      pvVar14 = malloc((long)(iVar18 * iVar19) * 2);
      image->data = pvVar14;
      pfVar15 = __ptr;
      for (lVar20 = 0; lVar20 < iVar18 * iVar19; lVar20 = lVar20 + 1) {
        fVar9 = roundf(*pfVar15 * 31.0);
        fVar8 = pfVar15[3];
        fVar10 = (float)*(undefined8 *)(pfVar15 + 1) * 31.0;
        fVar12 = (float)((ulong)*(undefined8 *)(pfVar15 + 1) >> 0x20) * 31.0;
        fVar11 = roundf(fVar10);
        fStack_44 = (float)(CONCAT17((char)((uint)fVar12 >> 0x18),
                                     CONCAT16((char)((uint)fVar12 >> 0x10),
                                              CONCAT15((char)((uint)fVar12 >> 8),
                                                       CONCAT14(SUB41(fVar12,0),fVar10)))) >> 0x20);
        fVar10 = roundf(fStack_44);
        iVar19 = (int)fVar11;
        iVar18 = (int)fVar10;
        cVar26 = (char)((uint)iVar18 >> 0x10);
        uVar7 = CONCAT15((char)((uint)iVar18 >> 8),CONCAT14((char)iVar18,iVar19));
        sVar4 = (short)iVar19;
        cVar27 = (0 < sVar4) * (sVar4 < 0x100) * (char)iVar19 - (0xff < sVar4);
        sVar4 = (short)((uint)iVar19 >> 0x10);
        sVar5 = (short)((uint6)uVar7 >> 0x20);
        cVar3 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar18 - (0xff < sVar5);
        sVar5 = (short)(CONCAT17((char)((uint)iVar18 >> 0x18),CONCAT16(cVar26,uVar7)) >> 0x30);
        sVar6 = CONCAT11((0 < sVar4) * (sVar4 < 0x100) * (char)((uint)iVar19 >> 0x10) -
                         (0xff < sVar4),cVar27);
        sVar4 = (short)(CONCAT13((0 < sVar5) * (sVar5 < 0x100) * cVar26 - (0xff < sVar5),
                                 CONCAT12(cVar3,sVar6)) >> 0x10);
        uVar2 = (ushort)(byte)((0 < sVar6) * (sVar6 < 0x100) * cVar27 - (0xff < sVar6)) * 0x40;
        sVar4 = (ushort)(byte)((0 < sVar4) * (sVar4 < 0x100) * cVar3 - (0xff < sVar4)) * 2;
        *(ushort *)((long)image->data + lVar20 * 2) =
             (ushort)(CONCAT13((char)((ushort)sVar4 >> 8),CONCAT12((char)sVar4,uVar2)) >> 0x10) |
             uVar2 | (ushort)(0.19607843 < fVar8) | (ushort)((int)fVar9 << 0xb);
        iVar19 = image->width;
        iVar18 = image->height;
        pfVar15 = pfVar15 + 4;
      }
      break;
    case 6:
      iVar19 = image->width;
      iVar18 = image->height;
      pvVar14 = malloc((long)(iVar18 * iVar19) * 2);
      image->data = pvVar14;
      pfVar15 = __ptr;
      for (lVar20 = 0; lVar20 < iVar18 * iVar19; lVar20 = lVar20 + 1) {
        fVar8 = roundf(*pfVar15 * 15.0);
        fVar9 = roundf(pfVar15[3] * 15.0);
        fVar10 = (float)*(undefined8 *)(pfVar15 + 1) * 15.0;
        fVar12 = (float)((ulong)*(undefined8 *)(pfVar15 + 1) >> 0x20) * 15.0;
        fVar11 = roundf(fVar10);
        fStack_44 = (float)(CONCAT17((char)((uint)fVar12 >> 0x18),
                                     CONCAT16((char)((uint)fVar12 >> 0x10),
                                              CONCAT15((char)((uint)fVar12 >> 8),
                                                       CONCAT14(SUB41(fVar12,0),fVar10)))) >> 0x20);
        fVar10 = roundf(fStack_44);
        iVar19 = (int)fVar11;
        iVar18 = (int)fVar10;
        cVar26 = (char)((uint)iVar18 >> 0x10);
        uVar7 = CONCAT15((char)((uint)iVar18 >> 8),CONCAT14((char)iVar18,iVar19));
        sVar4 = (short)iVar19;
        cVar27 = (0 < sVar4) * (sVar4 < 0x100) * (char)iVar19 - (0xff < sVar4);
        sVar4 = (short)((uint)iVar19 >> 0x10);
        sVar5 = (short)((uint6)uVar7 >> 0x20);
        cVar3 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar18 - (0xff < sVar5);
        sVar5 = (short)(CONCAT17((char)((uint)iVar18 >> 0x18),CONCAT16(cVar26,uVar7)) >> 0x30);
        sVar6 = CONCAT11((0 < sVar4) * (sVar4 < 0x100) * (char)((uint)iVar19 >> 0x10) -
                         (0xff < sVar4),cVar27);
        sVar4 = (short)(CONCAT13((0 < sVar5) * (sVar5 < 0x100) * cVar26 - (0xff < sVar5),
                                 CONCAT12(cVar3,sVar6)) >> 0x10);
        uVar2 = (ushort)(byte)((0 < sVar6) * (sVar6 < 0x100) * cVar27 - (0xff < sVar6)) * 0x100;
        sVar4 = (ushort)(byte)((0 < sVar4) * (sVar4 < 0x100) * cVar3 - (0xff < sVar4)) * 0x10;
        *(ushort *)((long)image->data + lVar20 * 2) =
             (ushort)(int)fVar9 & 0xff |
             (ushort)(CONCAT13((char)((ushort)sVar4 >> 8),CONCAT12((char)sVar4,uVar2)) >> 0x10) |
             uVar2 | (ushort)((int)fVar8 << 0xc);
        iVar19 = image->width;
        iVar18 = image->height;
        pfVar15 = pfVar15 + 4;
      }
      break;
    case 7:
      iVar19 = image->width;
      iVar18 = image->height;
      pvVar14 = malloc((long)(iVar19 * iVar18 * 4));
      image->data = pvVar14;
      for (lVar20 = 0; lVar20 < iVar18 * iVar19 * 4; lVar20 = lVar20 + 4) {
        *(char *)((long)image->data + lVar20) = (char)(int)(__ptr[lVar20] * 255.0);
        *(char *)((long)image->data + lVar20 + 1) = (char)(int)(__ptr[lVar20 + 1] * 255.0);
        *(char *)((long)image->data + lVar20 + 2) = (char)(int)(__ptr[lVar20 + 2] * 255.0);
        *(char *)((long)image->data + lVar20 + 3) = (char)(int)(__ptr[lVar20 + 3] * 255.0);
        iVar19 = image->width;
        iVar18 = image->height;
      }
      break;
    case 8:
      iVar19 = image->width;
      iVar18 = image->height;
      pvVar14 = malloc((long)(iVar18 * iVar19) << 2);
      image->data = pvVar14;
      pfVar15 = __ptr + 1;
      for (lVar20 = 0; lVar20 < iVar18 * iVar19; lVar20 = lVar20 + 1) {
        *(float *)((long)image->data + lVar20 * 4) =
             (float)((ulong)*(undefined8 *)pfVar15 >> 0x20) * 0.114 +
             pfVar15[-1] * 0.299 + (float)*(undefined8 *)pfVar15 * 0.587;
        iVar19 = image->width;
        iVar18 = image->height;
        pfVar15 = pfVar15 + 4;
      }
      break;
    case 9:
      iVar19 = image->width;
      iVar18 = image->height;
      pvVar14 = malloc((long)(iVar19 * iVar18 * 3) << 2);
      image->data = pvVar14;
      pfVar15 = __ptr + 2;
      for (lVar20 = 0; lVar20 < iVar18 * iVar19 * 3; lVar20 = lVar20 + 3) {
        *(float *)((long)image->data + lVar20 * 4) = pfVar15[-2];
        *(float *)((long)image->data + lVar20 * 4 + 4) = pfVar15[-1];
        *(float *)((long)image->data + lVar20 * 4 + 8) = *pfVar15;
        iVar19 = image->width;
        iVar18 = image->height;
        pfVar15 = pfVar15 + 4;
      }
      break;
    case 10:
      iVar19 = image->width;
      iVar18 = image->height;
      pvVar14 = malloc((long)(iVar19 * iVar18 * 4) << 2);
      image->data = pvVar14;
      for (lVar20 = 0; lVar20 < iVar18 * iVar19 * 4; lVar20 = lVar20 + 4) {
        *(float *)((long)image->data + lVar20 * 4) = __ptr[lVar20];
        *(float *)((long)image->data + lVar20 * 4 + 4) = __ptr[lVar20 + 1];
        *(float *)((long)image->data + lVar20 * 4 + 8) = __ptr[lVar20 + 2];
        *(float *)((long)image->data + lVar20 * 4 + 0xc) = __ptr[lVar20 + 3];
        iVar19 = image->width;
        iVar18 = image->height;
      }
      break;
    case 0xb:
      iVar19 = image->width;
      iVar18 = image->height;
      pvVar14 = malloc((long)(iVar18 * iVar19) * 2);
      image->data = pvVar14;
      pfVar15 = __ptr + 1;
      for (lVar20 = 0; lVar20 < iVar18 * iVar19; lVar20 = lVar20 + 1) {
        uVar13 = FloatToHalf((float)((ulong)*(undefined8 *)pfVar15 >> 0x20) * 0.114 +
                             pfVar15[-1] * 0.299 + (float)*(undefined8 *)pfVar15 * 0.587);
        *(unsigned_short *)((long)image->data + lVar20 * 2) = uVar13;
        iVar19 = image->width;
        iVar18 = image->height;
        pfVar15 = pfVar15 + 4;
      }
      break;
    case 0xc:
      iVar19 = image->width;
      iVar18 = image->height;
      pvVar14 = malloc((long)(iVar19 * iVar18 * 3) * 2);
      image->data = pvVar14;
      pfVar15 = __ptr + 2;
      for (lVar20 = 0; lVar20 < iVar18 * iVar19 * 3; lVar20 = lVar20 + 3) {
        uVar13 = FloatToHalf(pfVar15[-2]);
        *(unsigned_short *)((long)image->data + lVar20 * 2) = uVar13;
        uVar13 = FloatToHalf(pfVar15[-1]);
        *(unsigned_short *)((long)image->data + lVar20 * 2 + 2) = uVar13;
        uVar13 = FloatToHalf(*pfVar15);
        *(unsigned_short *)((long)image->data + lVar20 * 2 + 4) = uVar13;
        iVar19 = image->width;
        iVar18 = image->height;
        pfVar15 = pfVar15 + 4;
      }
      break;
    case 0xd:
      iVar19 = image->width;
      iVar18 = image->height;
      pvVar14 = malloc((long)(iVar19 * iVar18 * 4) * 2);
      image->data = pvVar14;
      for (lVar20 = 0; lVar20 < iVar18 * iVar19 * 4; lVar20 = lVar20 + 4) {
        uVar13 = FloatToHalf(__ptr[lVar20]);
        *(unsigned_short *)((long)image->data + lVar20 * 2) = uVar13;
        uVar13 = FloatToHalf(__ptr[lVar20 + 1]);
        *(unsigned_short *)((long)image->data + lVar20 * 2 + 2) = uVar13;
        uVar13 = FloatToHalf(__ptr[lVar20 + 2]);
        *(unsigned_short *)((long)image->data + lVar20 * 2 + 4) = uVar13;
        uVar13 = FloatToHalf(__ptr[lVar20 + 3]);
        *(unsigned_short *)((long)image->data + lVar20 * 2 + 6) = uVar13;
        iVar19 = image->width;
        iVar18 = image->height;
      }
    }
    free(__ptr);
    if ((1 < image->mipmaps) && (image->mipmaps = 1, image->data != (void *)0x0)) {
      ImageMipmaps(image);
      return;
    }
  }
  return;
}

Assistant:

void ImageFormat(Image *image, int newFormat)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if ((newFormat != 0) && (image->format != newFormat))
    {
        if ((image->format < PIXELFORMAT_COMPRESSED_DXT1_RGB) && (newFormat < PIXELFORMAT_COMPRESSED_DXT1_RGB))
        {
            Vector4 *pixels = LoadImageDataNormalized(*image);     // Supports 8 to 32 bit per channel

            RL_FREE(image->data);      // WARNING! We loose mipmaps data --> Regenerated at the end...
            image->data = NULL;
            image->format = newFormat;

            switch (image->format)
            {
                case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*sizeof(unsigned char));

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)((pixels[i].x*0.299f + pixels[i].y*0.587f + pixels[i].z*0.114f)*255.0f);
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*2*sizeof(unsigned char));

                    for (int i = 0, k = 0; i < image->width*image->height*2; i += 2, k++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)((pixels[k].x*0.299f + (float)pixels[k].y*0.587f + (float)pixels[k].z*0.114f)*255.0f);
                        ((unsigned char *)image->data)[i + 1] = (unsigned char)(pixels[k].w*255.0f);
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    unsigned char r = 0;
                    unsigned char g = 0;
                    unsigned char b = 0;

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        r = (unsigned char)(round(pixels[i].x*31.0f));
                        g = (unsigned char)(round(pixels[i].y*63.0f));
                        b = (unsigned char)(round(pixels[i].z*31.0f));

                        ((unsigned short *)image->data)[i] = (unsigned short)r << 11 | (unsigned short)g << 5 | (unsigned short)b;
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*3*sizeof(unsigned char));

                    for (int i = 0, k = 0; i < image->width*image->height*3; i += 3, k++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)(pixels[k].x*255.0f);
                        ((unsigned char *)image->data)[i + 1] = (unsigned char)(pixels[k].y*255.0f);
                        ((unsigned char *)image->data)[i + 2] = (unsigned char)(pixels[k].z*255.0f);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    unsigned char r = 0;
                    unsigned char g = 0;
                    unsigned char b = 0;
                    unsigned char a = 0;

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        r = (unsigned char)(round(pixels[i].x*31.0f));
                        g = (unsigned char)(round(pixels[i].y*31.0f));
                        b = (unsigned char)(round(pixels[i].z*31.0f));
                        a = (pixels[i].w > ((float)PIXELFORMAT_UNCOMPRESSED_R5G5B5A1_ALPHA_THRESHOLD/255.0f))? 1 : 0;

                        ((unsigned short *)image->data)[i] = (unsigned short)r << 11 | (unsigned short)g << 6 | (unsigned short)b << 1 | (unsigned short)a;
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    unsigned char r = 0;
                    unsigned char g = 0;
                    unsigned char b = 0;
                    unsigned char a = 0;

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        r = (unsigned char)(round(pixels[i].x*15.0f));
                        g = (unsigned char)(round(pixels[i].y*15.0f));
                        b = (unsigned char)(round(pixels[i].z*15.0f));
                        a = (unsigned char)(round(pixels[i].w*15.0f));

                        ((unsigned short *)image->data)[i] = (unsigned short)r << 12 | (unsigned short)g << 8 | (unsigned short)b << 4 | (unsigned short)a;
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*4*sizeof(unsigned char));

                    for (int i = 0, k = 0; i < image->width*image->height*4; i += 4, k++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)(pixels[k].x*255.0f);
                        ((unsigned char *)image->data)[i + 1] = (unsigned char)(pixels[k].y*255.0f);
                        ((unsigned char *)image->data)[i + 2] = (unsigned char)(pixels[k].z*255.0f);
                        ((unsigned char *)image->data)[i + 3] = (unsigned char)(pixels[k].w*255.0f);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32:
                {
                    // WARNING: Image is converted to GRAYSCALE equivalent 32bit

                    image->data = (float *)RL_MALLOC(image->width*image->height*sizeof(float));

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        ((float *)image->data)[i] = (float)(pixels[i].x*0.299f + pixels[i].y*0.587f + pixels[i].z*0.114f);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32:
                {
                    image->data = (float *)RL_MALLOC(image->width*image->height*3*sizeof(float));

                    for (int i = 0, k = 0; i < image->width*image->height*3; i += 3, k++)
                    {
                        ((float *)image->data)[i] = pixels[k].x;
                        ((float *)image->data)[i + 1] = pixels[k].y;
                        ((float *)image->data)[i + 2] = pixels[k].z;
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32:
                {
                    image->data = (float *)RL_MALLOC(image->width*image->height*4*sizeof(float));

                    for (int i = 0, k = 0; i < image->width*image->height*4; i += 4, k++)
                    {
                        ((float *)image->data)[i] = pixels[k].x;
                        ((float *)image->data)[i + 1] = pixels[k].y;
                        ((float *)image->data)[i + 2] = pixels[k].z;
                        ((float *)image->data)[i + 3] = pixels[k].w;
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R16:
                {
                    // WARNING: Image is converted to GRAYSCALE equivalent 16bit

                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        ((unsigned short *)image->data)[i] = FloatToHalf((float)(pixels[i].x*0.299f + pixels[i].y*0.587f + pixels[i].z*0.114f));
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R16G16B16:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*3*sizeof(unsigned short));

                    for (int i = 0, k = 0; i < image->width*image->height*3; i += 3, k++)
                    {
                        ((unsigned short *)image->data)[i] = FloatToHalf(pixels[k].x);
                        ((unsigned short *)image->data)[i + 1] = FloatToHalf(pixels[k].y);
                        ((unsigned short *)image->data)[i + 2] = FloatToHalf(pixels[k].z);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R16G16B16A16:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*4*sizeof(unsigned short));

                    for (int i = 0, k = 0; i < image->width*image->height*4; i += 4, k++)
                    {
                        ((unsigned short *)image->data)[i] = FloatToHalf(pixels[k].x);
                        ((unsigned short *)image->data)[i + 1] = FloatToHalf(pixels[k].y);
                        ((unsigned short *)image->data)[i + 2] = FloatToHalf(pixels[k].z);
                        ((unsigned short *)image->data)[i + 3] = FloatToHalf(pixels[k].w);
                    }
                } break;
                default: break;
            }

            RL_FREE(pixels);
            pixels = NULL;

            // In case original image had mipmaps, generate mipmaps for formatted image
            // NOTE: Original mipmaps are replaced by new ones, if custom mipmaps were used, they are lost
            if (image->mipmaps > 1)
            {
                image->mipmaps = 1;
            #if defined(SUPPORT_IMAGE_MANIPULATION)
                if (image->data != NULL) ImageMipmaps(image);
            #endif
            }
        }
        else TRACELOG(LOG_WARNING, "IMAGE: Data format is compressed, can not be converted");
    }
}